

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,DimensionPrinter>::
ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<int>,int>::LinearExprHandler>
          (void *param_1,uint param_2)

{
  double coef;
  int var_index;
  int i;
  int in_stack_ffffffffffffffcc;
  undefined4 local_18;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_DimensionPrinter> *this;
  
  this = (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_DimensionPrinter>
          *)param_1;
  for (local_18 = 0; local_18 < (int)param_2; local_18 = local_18 + 1) {
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_DimensionPrinter>::
    ReadUInt(this,param_2);
    BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
              ((BinaryReader<mp::internal::EndiannessConverter> *)param_1);
    BinaryReaderBase::ReadTillEndOfLine(*param_1);
    NLHandler<mp::NullNLHandler<int>,_int>::LinearExprHandler::AddTerm
              ((LinearExprHandler *)param_1,in_stack_ffffffffffffffcc,6.07844517487673e-318);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}